

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O2

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,string_view argString)

{
  element_type *peVar1;
  undefined1 this_00 [8];
  ParseOutput PVar2;
  int iVar3;
  size_type sVar4;
  undefined4 extraout_var;
  string_view brokerName;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string_view argString_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  argString_local._M_str = argString._M_str;
  argString_local._M_len = argString._M_len;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&argString_local,'-',0);
  if (sVar4 == 0xffffffffffffffff) {
    brokerName._M_str = (char *)argString_local._M_len;
    brokerName._M_len = (size_t)&local_48;
    BrokerFactory::findBroker(brokerName);
    CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
    peVar1 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar3 = (*peVar1->_vptr_Broker[0xb])();
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&this->name,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var,iVar3));
      return;
    }
  }
  generateParser((BrokerApp *)local_60,SUB81(this,0));
  this_00 = local_60;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_48,&argString_local,&local_61);
  PVar2 = helicsCLI11App::helics_parse<std::__cxx11::string>((helicsCLI11App *)this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (PVar2 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)local_60);
  }
  if ((tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)local_60 !=
      (_Head_base<0UL,_helics::helicsCLI11App_*,_false>)0x0) {
    (*((App *)local_60)->_vptr_App[1])();
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(std::string_view argString)
{
    if (argString.find_first_of('-') == std::string_view::npos) {
        broker = BrokerFactory::findBroker(argString);
        if (broker) {
            name = broker->getIdentifier();
            return;
        }
    }
    auto app = generateParser();
    if (app->helics_parse(std::string(argString)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}